

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cc
# Opt level: O0

void __thiscall re2::DFA::ClearCache(DFA *this)

{
  bool bVar1;
  reference ppSVar2;
  undefined8 *in_RDI;
  int mem;
  int nnext;
  int ninst;
  iterator tmp;
  iterator end;
  iterator begin;
  unordered_set<re2::DFA::State_*,_re2::DFA::StateHash,_re2::DFA::StateEqual,_std::allocator<re2::DFA::State_*>_>
  *in_stack_ffffffffffffffa8;
  __node_type **__p;
  new_allocator<char> *in_stack_ffffffffffffffb0;
  new_allocator<char> local_2d;
  int local_2c;
  int local_28;
  int local_24;
  __node_type *local_20;
  _Node_iterator_base<re2::DFA::State_*,_true> local_18;
  _Node_iterator_base<re2::DFA::State_*,_true> local_10 [2];
  
  local_10[0]._M_cur =
       (__node_type *)
       std::
       unordered_set<re2::DFA::State_*,_re2::DFA::StateHash,_re2::DFA::StateEqual,_std::allocator<re2::DFA::State_*>_>
       ::begin(in_stack_ffffffffffffffa8);
  local_18._M_cur =
       (__node_type *)
       std::
       unordered_set<re2::DFA::State_*,_re2::DFA::StateHash,_re2::DFA::StateEqual,_std::allocator<re2::DFA::State_*>_>
       ::end(in_stack_ffffffffffffffa8);
  while( true ) {
    bVar1 = std::__detail::operator!=(local_10,&local_18);
    if (!bVar1) break;
    local_20 = local_10[0]._M_cur;
    std::__detail::_Node_iterator<re2::DFA::State_*,_true,_true>::operator++
              ((_Node_iterator<re2::DFA::State_*,_true,_true> *)in_stack_ffffffffffffffb0);
    __p = &local_20;
    ppSVar2 = std::__detail::_Node_iterator<re2::DFA::State_*,_true,_true>::operator*
                        ((_Node_iterator<re2::DFA::State_*,_true,_true> *)0x241524);
    local_24 = (*ppSVar2)->ninst_;
    local_28 = Prog::bytemap_range((Prog *)*in_RDI);
    local_28 = local_28 + 1;
    local_2c = local_24 * 4 + 0x10 + local_28 * 8;
    in_stack_ffffffffffffffb0 = &local_2d;
    std::allocator<char>::allocator();
    std::__detail::_Node_iterator<re2::DFA::State_*,_true,_true>::operator*
              ((_Node_iterator<re2::DFA::State_*,_true,_true> *)0x241573);
    __gnu_cxx::new_allocator<char>::deallocate(in_stack_ffffffffffffffb0,(char *)__p,0x241585);
    std::allocator<char>::~allocator((allocator<char> *)&local_2d);
  }
  std::
  unordered_set<re2::DFA::State_*,_re2::DFA::StateHash,_re2::DFA::StateEqual,_std::allocator<re2::DFA::State_*>_>
  ::clear((unordered_set<re2::DFA::State_*,_re2::DFA::StateHash,_re2::DFA::StateEqual,_std::allocator<re2::DFA::State_*>_>
           *)0x2415c1);
  return;
}

Assistant:

void DFA::ClearCache() {
  StateSet::iterator begin = state_cache_.begin();
  StateSet::iterator end = state_cache_.end();
  while (begin != end) {
    StateSet::iterator tmp = begin;
    ++begin;
    // Deallocate the blob of memory that we allocated in DFA::CachedState().
    // We recompute mem in order to benefit from sized delete where possible.
    int ninst = (*tmp)->ninst_;
    int nnext = prog_->bytemap_range() + 1;  // + 1 for kByteEndText slot
    int mem = sizeof(State) + nnext*sizeof(std::atomic<State*>) +
              ninst*sizeof(int);
    std::allocator<char>().deallocate(reinterpret_cast<char*>(*tmp), mem);
  }
  state_cache_.clear();
}